

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O0

void kmpc_poolprint(void)

{
  int gtid;
  kmp_info_t *th;
  kmp_info_t *in_stack_00000010;
  kmp_info_t *in_stack_00000038;
  
  gtid = __kmp_get_global_thread_id();
  __kmp_thread_from_gtid(gtid);
  __kmp_bget_dequeue(in_stack_00000010);
  bfreed(in_stack_00000038);
  return;
}

Assistant:

void kmpc_poolprint(void) {
  kmp_info_t *th = __kmp_get_thread();

  __kmp_bget_dequeue(th); /* Release any queued buffers */

  bfreed(th);
}